

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::iuUniversalPrinter<int[3]>::Print(int (*a) [3],iu_ostream *os)

{
  long lVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  std::ostream::operator<<(os,(*a)[0]);
  lVar1 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    std::ostream::operator<<(os,(*a)[lVar1 + 1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 2);
  std::__ostream_insert<char,std::char_traits<char>>(os," }",2);
  return;
}

Assistant:

static void Print(const T(&a)[SIZE], iu_ostream* os)
    {
        UniversalPrintArray(a, SIZE, os);
    }